

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

void ikcp_flush(ikcpcb *kcp)

{
  IINT32 *pIVar1;
  IQUEUEHEAD *pIVar2;
  IUINT32 IVar3;
  IUINT32 IVar4;
  IUINT32 *data;
  IQUEUEHEAD *pIVar5;
  IQUEUEHEAD *pIVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  IINT32 *pIVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  IUINT32 IVar15;
  int iVar16;
  IUINT32 IVar17;
  undefined2 uVar18;
  ulong uVar19;
  ulong uVar20;
  IKCPSEG *segment;
  ulong uVar21;
  IQUEUEHEAD *pIVar22;
  IUINT32 IVar23;
  IUINT32 *__dest;
  int local_50;
  
  if (kcp->updated != 0) {
    IVar3 = kcp->current;
    data = (IUINT32 *)kcp->buffer;
    IVar4 = kcp->conv;
    uVar20 = 0;
    uVar19 = (ulong)(kcp->rcv_wnd - kcp->nrcv_que);
    if (kcp->rcv_wnd < kcp->nrcv_que) {
      uVar19 = uVar20;
    }
    uVar21 = (ulong)kcp->ackcount;
    if ((int)kcp->ackcount < 1) {
      uVar21 = uVar20;
    }
    IVar15 = kcp->rcv_nxt;
    IVar23 = 0;
    IVar17 = 0;
    __dest = data;
    while( true ) {
      iVar13 = (int)data;
      uVar18 = (undefined2)uVar19;
      if (uVar21 == uVar20) break;
      iVar13 = (int)__dest - iVar13;
      if ((int)kcp->mtu < iVar13 + 0x18) {
        ikcp_output(kcp,data,iVar13);
        __dest = data;
      }
      IVar17 = kcp->acklist[uVar20 * 2];
      IVar23 = kcp->acklist[uVar20 * 2 + 1];
      *__dest = IVar4;
      *(undefined2 *)(__dest + 1) = 0x52;
      *(undefined2 *)((long)__dest + 6) = uVar18;
      __dest[2] = IVar23;
      __dest[3] = IVar17;
      __dest[4] = IVar15;
      __dest[5] = 0;
      __dest = __dest + 6;
      uVar20 = uVar20 + 1;
    }
    kcp->ackcount = 0;
    if (kcp->rmt_wnd == 0) {
      uVar8 = kcp->probe_wait;
      if (uVar8 == 0) {
        kcp->probe_wait = 7000;
        kcp->ts_probe = kcp->current + 7000;
      }
      else if (-1 < (int)(kcp->current - kcp->ts_probe)) {
        uVar10 = 7000;
        if (7000 < uVar8) {
          uVar10 = uVar8;
        }
        uVar10 = (uVar10 >> 1) + uVar10;
        if (119999 < uVar10) {
          uVar10 = 120000;
        }
        kcp->probe_wait = uVar10;
        kcp->ts_probe = uVar10 + kcp->current;
        *(byte *)&kcp->probe = (byte)kcp->probe | 1;
      }
    }
    else {
      kcp->ts_probe = 0;
      kcp->probe_wait = 0;
    }
    uVar8 = kcp->probe;
    if ((uVar8 & 1) != 0) {
      iVar14 = (int)__dest - iVar13;
      if ((int)kcp->mtu < iVar14 + 0x18) {
        ikcp_output(kcp,data,iVar14);
        __dest = data;
      }
      *__dest = IVar4;
      *(undefined2 *)(__dest + 1) = 0x53;
      *(undefined2 *)((long)__dest + 6) = uVar18;
      __dest[2] = IVar23;
      __dest[3] = IVar17;
      __dest[4] = IVar15;
      __dest[5] = 0;
      __dest = __dest + 6;
      uVar8 = kcp->probe;
    }
    if ((uVar8 & 2) != 0) {
      iVar14 = (int)__dest - iVar13;
      if ((int)kcp->mtu < iVar14 + 0x18) {
        ikcp_output(kcp,data,iVar14);
        __dest = data;
      }
      *__dest = IVar4;
      *(undefined2 *)(__dest + 1) = 0x54;
      *(undefined2 *)((long)__dest + 6) = uVar18;
      __dest[2] = IVar23;
      __dest[3] = IVar17;
      __dest[4] = IVar15;
      __dest[5] = 0;
      __dest = __dest + 6;
    }
    kcp->probe = 0;
    uVar8 = kcp->rmt_wnd;
    if (kcp->snd_wnd < kcp->rmt_wnd) {
      uVar8 = kcp->snd_wnd;
    }
    if ((kcp->nocwnd == 0) && (kcp->cwnd < uVar8)) {
      uVar8 = kcp->cwnd;
    }
    pIVar2 = &kcp->snd_buf;
    pIVar1 = &kcp->rx_rto;
    IVar4 = kcp->snd_una;
    IVar15 = kcp->snd_nxt;
    while (((int)(IVar15 - (IVar4 + uVar8)) < 0 &&
           (pIVar22 = (kcp->snd_queue).next, &kcp->snd_queue != pIVar22))) {
      pIVar5 = pIVar22->next;
      pIVar6 = pIVar22->prev;
      pIVar5->prev = pIVar6;
      pIVar6->next = pIVar5;
      pIVar22->next = (IQUEUEHEAD *)0x0;
      pIVar22->prev = (IQUEUEHEAD *)0x0;
      pIVar5 = (kcp->snd_buf).prev;
      pIVar22->prev = pIVar5;
      pIVar22->next = pIVar2;
      pIVar5->next = pIVar22;
      (kcp->snd_buf).prev = pIVar22;
      kcp->nsnd_que = kcp->nsnd_que - 1;
      kcp->nsnd_buf = kcp->nsnd_buf + 1;
      *(IUINT32 *)&pIVar22[1].next = kcp->conv;
      *(undefined4 *)((long)&pIVar22[1].next + 4) = 0x51;
      *(int *)((long)&pIVar22[1].prev + 4) = (int)uVar19;
      *(IUINT32 *)&pIVar22[2].next = IVar3;
      kcp->snd_nxt = IVar15 + 1;
      *(IUINT32 *)((long)&pIVar22[2].next + 4) = IVar15;
      *(IUINT32 *)&pIVar22[2].prev = kcp->rcv_nxt;
      *(IUINT32 *)&pIVar22[3].next = IVar3;
      *(IINT32 *)((long)&pIVar22[3].next + 4) = kcp->rx_rto;
      pIVar22[3].prev = (IQUEUEHEAD *)0x0;
      IVar15 = IVar15 + 1;
    }
    uVar10 = 0xffffffff;
    if (0 < kcp->fastresend) {
      uVar10 = kcp->fastresend;
    }
    local_50 = 0;
    iVar14 = 0;
    if (kcp->nodelay == 0) {
      iVar14 = *pIVar1 >> 3;
    }
    bVar7 = false;
    pIVar22 = pIVar2;
    while( true ) {
      pIVar22 = pIVar22->next;
      if (pIVar22 == pIVar2) break;
      iVar16 = *(int *)((long)&pIVar22[3].prev + 4);
      if (iVar16 == 0) {
        *(undefined4 *)((long)&pIVar22[3].prev + 4) = 1;
        iVar16 = *pIVar1;
        *(int *)((long)&pIVar22[3].next + 4) = iVar16;
        *(IUINT32 *)&pIVar22[3].next = iVar16 + iVar14 + IVar3;
        goto LAB_00141601;
      }
      if (-1 < (int)(IVar3 - *(int *)&pIVar22[3].next)) {
        *(int *)((long)&pIVar22[3].prev + 4) = iVar16 + 1;
        kcp->xmit = kcp->xmit + 1;
        if (kcp->nodelay == 1) {
          pIVar11 = (IINT32 *)((long)&pIVar22[3].next + 4);
LAB_001415e0:
          iVar16 = *pIVar11 / 2 + *(int *)((long)&pIVar22[3].next + 4);
        }
        else {
          pIVar11 = pIVar1;
          if (kcp->nodelay != 0) goto LAB_001415e0;
          uVar12 = *(uint *)((long)&pIVar22[3].next + 4);
          uVar9 = *pIVar1;
          if ((uint)*pIVar1 < uVar12) {
            uVar9 = uVar12;
          }
          iVar16 = uVar9 + uVar12;
        }
        *(int *)((long)&pIVar22[3].next + 4) = iVar16;
        *(IUINT32 *)&pIVar22[3].next = iVar16 + IVar3;
        bVar7 = true;
        goto LAB_00141601;
      }
      if ((uVar10 <= *(uint *)&pIVar22[3].prev) &&
         ((iVar16 <= kcp->fastlimit || (kcp->fastlimit < 1)))) {
        *(int *)((long)&pIVar22[3].prev + 4) = iVar16 + 1;
        *(undefined4 *)&pIVar22[3].prev = 0;
        *(IUINT32 *)&pIVar22[3].next = *(int *)((long)&pIVar22[3].next + 4) + IVar3;
        local_50 = local_50 + 1;
LAB_00141601:
        *(IUINT32 *)&pIVar22[2].next = IVar3;
        *(int *)((long)&pIVar22[1].prev + 4) = (int)uVar19;
        *(IUINT32 *)&pIVar22[2].prev = kcp->rcv_nxt;
        iVar16 = (int)__dest - iVar13;
        if ((int)kcp->mtu < *(int *)((long)&pIVar22[2].prev + 4) + iVar16 + 0x18) {
          ikcp_output(kcp,data,iVar16);
          __dest = data;
        }
        *__dest = *(IUINT32 *)&pIVar22[1].next;
        *(char *)(__dest + 1) = *(char *)((long)&pIVar22[1].next + 4);
        *(char *)((long)__dest + 5) = *(char *)&pIVar22[1].prev;
        *(undefined2 *)((long)__dest + 6) = *(undefined2 *)((long)&pIVar22[1].prev + 4);
        __dest[2] = *(IUINT32 *)&pIVar22[2].next;
        __dest[3] = *(IUINT32 *)((long)&pIVar22[2].next + 4);
        __dest[4] = *(IUINT32 *)&pIVar22[2].prev;
        __dest[5] = *(IUINT32 *)((long)&pIVar22[2].prev + 4);
        __dest = __dest + 6;
        uVar20 = (ulong)*(uint *)((long)&pIVar22[2].prev + 4);
        if (uVar20 != 0) {
          memcpy(__dest,pIVar22 + 4,uVar20);
          __dest = (IUINT32 *)((long)__dest + (ulong)*(uint *)((long)&pIVar22[2].prev + 4));
        }
        if (kcp->dead_link <= *(uint *)((long)&pIVar22[3].prev + 4)) {
          kcp->state = 0xffffffff;
        }
      }
    }
    iVar13 = (int)__dest - iVar13;
    if (0 < iVar13) {
      ikcp_output(kcp,data,iVar13);
    }
    if (local_50 != 0) {
      uVar9 = kcp->snd_nxt - kcp->snd_una;
      uVar12 = uVar9 >> 1;
      if (uVar9 < 4) {
        uVar12 = 2;
      }
      kcp->ssthresh = uVar12;
      kcp->cwnd = uVar12 + uVar10;
      kcp->incr = (uVar12 + uVar10) * kcp->mss;
    }
    if (bVar7) {
      uVar10 = uVar8 >> 1;
      if (uVar8 < 4) {
        uVar10 = 2;
      }
      kcp->ssthresh = uVar10;
    }
    else if (kcp->cwnd != 0) {
      return;
    }
    kcp->cwnd = 1;
    kcp->incr = kcp->mss;
  }
  return;
}

Assistant:

void ikcp_flush(ikcpcb *kcp)
{
	IUINT32 current = kcp->current;
	char *buffer = kcp->buffer;
	char *ptr = buffer;
	int count, size, i;
	IUINT32 resent, cwnd;
	IUINT32 rtomin;
	struct IQUEUEHEAD *p;
	int change = 0;
	int lost = 0;
	IKCPSEG seg;

	// 'ikcp_update' haven't been called. 
	if (kcp->updated == 0) return;

	seg.conv = kcp->conv;
	seg.cmd = IKCP_CMD_ACK;
	seg.frg = 0;
	seg.wnd = ikcp_wnd_unused(kcp);
	seg.una = kcp->rcv_nxt;
	seg.len = 0;
	seg.sn = 0;
	seg.ts = 0;

	// flush acknowledges
	count = kcp->ackcount;
	for (i = 0; i < count; i++) {
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ikcp_ack_get(kcp, i, &seg.sn, &seg.ts);
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->ackcount = 0;

	// probe window size (if remote window size equals zero)
	if (kcp->rmt_wnd == 0) {
		if (kcp->probe_wait == 0) {
			kcp->probe_wait = IKCP_PROBE_INIT;
			kcp->ts_probe = kcp->current + kcp->probe_wait;
		}	
		else {
			if (_itimediff(kcp->current, kcp->ts_probe) >= 0) {
				if (kcp->probe_wait < IKCP_PROBE_INIT) 
					kcp->probe_wait = IKCP_PROBE_INIT;
				kcp->probe_wait += kcp->probe_wait / 2;
				if (kcp->probe_wait > IKCP_PROBE_LIMIT)
					kcp->probe_wait = IKCP_PROBE_LIMIT;
				kcp->ts_probe = kcp->current + kcp->probe_wait;
				kcp->probe |= IKCP_ASK_SEND;
			}
		}
	}	else {
		kcp->ts_probe = 0;
		kcp->probe_wait = 0;
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_SEND) {
		seg.cmd = IKCP_CMD_WASK;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	// flush window probing commands
	if (kcp->probe & IKCP_ASK_TELL) {
		seg.cmd = IKCP_CMD_WINS;
		size = (int)(ptr - buffer);
		if (size + (int)IKCP_OVERHEAD > (int)kcp->mtu) {
			ikcp_output(kcp, buffer, size);
			ptr = buffer;
		}
		ptr = ikcp_encode_seg(ptr, &seg);
	}

	kcp->probe = 0;

	// calculate window size
	cwnd = _imin_(kcp->snd_wnd, kcp->rmt_wnd);
	if (kcp->nocwnd == 0) cwnd = _imin_(kcp->cwnd, cwnd);

	// move data from snd_queue to snd_buf
	while (_itimediff(kcp->snd_nxt, kcp->snd_una + cwnd) < 0) {
		IKCPSEG *newseg;
		if (iqueue_is_empty(&kcp->snd_queue)) break;

		newseg = iqueue_entry(kcp->snd_queue.next, IKCPSEG, node);

		iqueue_del(&newseg->node);
		iqueue_add_tail(&newseg->node, &kcp->snd_buf);
		kcp->nsnd_que--;
		kcp->nsnd_buf++;

		newseg->conv = kcp->conv;
		newseg->cmd = IKCP_CMD_PUSH;
		newseg->wnd = seg.wnd;
		newseg->ts = current;
		newseg->sn = kcp->snd_nxt++;
		newseg->una = kcp->rcv_nxt;
		newseg->resendts = current;
		newseg->rto = kcp->rx_rto;
		newseg->fastack = 0;
		newseg->xmit = 0;
	}

	// calculate resent
	resent = (kcp->fastresend > 0)? (IUINT32)kcp->fastresend : 0xffffffff;
	rtomin = (kcp->nodelay == 0)? (kcp->rx_rto >> 3) : 0;

	// flush data segments
	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = p->next) {
		IKCPSEG *segment = iqueue_entry(p, IKCPSEG, node);
		int needsend = 0;
		if (segment->xmit == 0) {
			needsend = 1;
			segment->xmit++;
			segment->rto = kcp->rx_rto;
			segment->resendts = current + segment->rto + rtomin;
		}
		else if (_itimediff(current, segment->resendts) >= 0) {
			needsend = 1;
			segment->xmit++;
			kcp->xmit++;
			if (kcp->nodelay == 0) {
				segment->rto += _imax_(segment->rto, (IUINT32)kcp->rx_rto);
			}	else {
				IINT32 step = (kcp->nodelay < 2)? 
					((IINT32)(segment->rto)) : kcp->rx_rto;
				segment->rto += step / 2;
			}
			segment->resendts = current + segment->rto;
			lost = 1;
		}
		else if (segment->fastack >= resent) {
			if ((int)segment->xmit <= kcp->fastlimit || 
				kcp->fastlimit <= 0) {
				needsend = 1;
				segment->xmit++;
				segment->fastack = 0;
				segment->resendts = current + segment->rto;
				change++;
			}
		}

		if (needsend) {
			int need;
			segment->ts = current;
			segment->wnd = seg.wnd;
			segment->una = kcp->rcv_nxt;

			size = (int)(ptr - buffer);
			need = IKCP_OVERHEAD + segment->len;

			if (size + need > (int)kcp->mtu) {
				ikcp_output(kcp, buffer, size);
				ptr = buffer;
			}

			ptr = ikcp_encode_seg(ptr, segment);

			if (segment->len > 0) {
				memcpy(ptr, segment->data, segment->len);
				ptr += segment->len;
			}

			if (segment->xmit >= kcp->dead_link) {
				kcp->state = (IUINT32)-1;
			}
		}
	}

	// flash remain segments
	size = (int)(ptr - buffer);
	if (size > 0) {
		ikcp_output(kcp, buffer, size);
	}

	// update ssthresh
	if (change) {
		IUINT32 inflight = kcp->snd_nxt - kcp->snd_una;
		kcp->ssthresh = inflight / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = kcp->ssthresh + resent;
		kcp->incr = kcp->cwnd * kcp->mss;
	}

	if (lost) {
		kcp->ssthresh = cwnd / 2;
		if (kcp->ssthresh < IKCP_THRESH_MIN)
			kcp->ssthresh = IKCP_THRESH_MIN;
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}

	if (kcp->cwnd < 1) {
		kcp->cwnd = 1;
		kcp->incr = kcp->mss;
	}
}